

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::DuckTableScanInitGlobal
          (duckdb *this,ClientContext *context,TableFunctionInitInput *input,DataTable *storage,
          TableScanBindData *bind_data)

{
  pointer pCVar1;
  bool bVar2;
  pointer pDVar3;
  ColumnList *this_00;
  ColumnDefinition *this_01;
  LogicalType *__x;
  pointer *__ptr;
  ColumnIndex *col_idx;
  pointer pCVar4;
  _Head_base<0UL,_duckdb::DuckTableScanState_*,_false> local_48;
  __uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  local_40;
  FunctionData *local_38;
  
  local_38 = (input->bind_data).ptr;
  local_40._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       (tuple<duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
        )(tuple<duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )this;
  make_uniq<duckdb::DuckTableScanState,duckdb::ClientContext&,duckdb::FunctionData_const*>
            ((duckdb *)&local_48,context,&local_38);
  pDVar3 = unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
           ::operator->((unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
                         *)&local_48);
  DataTable::InitializeParallelScan(storage,context,&pDVar3->state);
  bVar2 = TableFunctionInitInput::CanRemoveFilterColumns(input);
  if (bVar2) {
    pDVar3 = unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
             ::operator->((unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
                           *)&local_48);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &(pDVar3->super_TableScanGlobalState).projection_ids,
               &(input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
    ;
    this_00 = TableCatalogEntry::GetColumns(bind_data->table);
    pCVar1 = (input->column_indexes).
             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar4 = (input->column_indexes).
                  super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start; pCVar4 != pCVar1; pCVar4 = pCVar4 + 1) {
      if (pCVar4->index == 0xffffffffffffffff) {
        pDVar3 = unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
                 ::operator->((unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
                               *)&local_48);
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalTypeId_const&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                   &(pDVar3->super_TableScanGlobalState).scanned_types,&LogicalType::ROW_TYPE);
      }
      else {
        pDVar3 = unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
                 ::operator->((unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
                               *)&local_48);
        this_01 = ColumnList::GetColumn(this_00,(LogicalIndex)pCVar4->index);
        __x = ColumnDefinition::Type(this_01);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&(pDVar3->super_TableScanGlobalState).scanned_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
      }
    }
  }
  *(DuckTableScanState **)
   local_40._M_t.
   super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
   .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       local_48._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(_Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )local_40._M_t.
             super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckTableScanInitGlobal(ClientContext &context, TableFunctionInitInput &input,
                                                             DataTable &storage, const TableScanBindData &bind_data) {
	auto g_state = make_uniq<DuckTableScanState>(context, input.bind_data.get());
	storage.InitializeParallelScan(context, g_state->state);
	if (!input.CanRemoveFilterColumns()) {
		return std::move(g_state);
	}

	g_state->projection_ids = input.projection_ids;
	auto &duck_table = bind_data.table.Cast<DuckTableEntry>();
	const auto &columns = duck_table.GetColumns();
	for (const auto &col_idx : input.column_indexes) {
		if (col_idx.IsRowIdColumn()) {
			g_state->scanned_types.emplace_back(LogicalType::ROW_TYPE);
		} else {
			g_state->scanned_types.push_back(columns.GetColumn(col_idx.ToLogical()).Type());
		}
	}
	return std::move(g_state);
}